

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

bool QUtil::pdf_time_to_qpdf_time(string *str,QPDFTime *qtm)

{
  bool bVar1;
  int iVar2;
  int month;
  int day;
  int hour;
  int minute;
  int second;
  const_reference pvVar3;
  string_type local_180;
  string_type local_160;
  string_type local_140;
  string_type local_120;
  string_type local_100;
  string_type local_e0;
  QPDFTime local_bc;
  string_type local_a0;
  string_type local_80;
  anon_class_1_0_00000001 local_59;
  int local_58;
  undefined4 uStack_54;
  anon_class_1_0_00000001 to_i;
  int tz_delta;
  smatch m;
  QPDFTime *qtm_local;
  string *str_local;
  
  if ((pdf_time_to_qpdf_time(std::__cxx11::string_const&,QUtil::QPDFTime*)::pdf_date_abi_cxx11_ ==
       '\0') &&
     (iVar2 = __cxa_guard_acquire(&pdf_time_to_qpdf_time(std::__cxx11::string_const&,QUtil::QPDFTime*)
                                   ::pdf_date_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&pdf_time_to_qpdf_time(std::__cxx11::string_const&,QUtil::QPDFTime*)::
                pdf_date_abi_cxx11_,
               "^D:([0-9]{4})([0-9]{2})([0-9]{2})([0-9]{2})([0-9]{2})([0-9]{2})(?:(Z?)|([\\+\\-])([0-9]{2})\'([0-9]{2})\')$"
               ,0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &pdf_time_to_qpdf_time(std::__cxx11::string_const&,QUtil::QPDFTime*)::
                  pdf_date_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&pdf_time_to_qpdf_time(std::__cxx11::string_const&,QUtil::QPDFTime*)::
                         pdf_date_abi_cxx11_);
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&tz_delta);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (str,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&tz_delta,
                     &pdf_time_to_qpdf_time(std::__cxx11::string_const&,QUtil::QPDFTime*)::
                      pdf_date_abi_cxx11_,0);
  if (bVar1) {
    local_58 = 0;
    pvVar3 = std::__cxx11::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)&tz_delta,8);
    bVar1 = std::__cxx11::operator!=(pvVar3,"");
    if (bVar1) {
      pvVar3 = std::__cxx11::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)&tz_delta,9);
      std::__cxx11::sub_match::operator_cast_to_string(&local_80,(sub_match *)pvVar3);
      iVar2 = pdf_time_to_qpdf_time::anon_class_1_0_00000001::operator()(&local_59,&local_80);
      pvVar3 = std::__cxx11::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)&tz_delta,10);
      std::__cxx11::sub_match::operator_cast_to_string(&local_a0,(sub_match *)pvVar3);
      local_58 = pdf_time_to_qpdf_time::anon_class_1_0_00000001::operator()(&local_59,&local_a0);
      local_58 = iVar2 * 0x3c + local_58;
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_80);
      pvVar3 = std::__cxx11::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)&tz_delta,8);
      bVar1 = std::__cxx11::operator==(pvVar3,"+");
      if (bVar1) {
        local_58 = -local_58;
      }
    }
    if (qtm != (QPDFTime *)0x0) {
      pvVar3 = std::__cxx11::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)&tz_delta,1);
      std::__cxx11::sub_match::operator_cast_to_string(&local_e0,(sub_match *)pvVar3);
      iVar2 = pdf_time_to_qpdf_time::anon_class_1_0_00000001::operator()(&local_59,&local_e0);
      pvVar3 = std::__cxx11::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)&tz_delta,2);
      std::__cxx11::sub_match::operator_cast_to_string(&local_100,(sub_match *)pvVar3);
      month = pdf_time_to_qpdf_time::anon_class_1_0_00000001::operator()(&local_59,&local_100);
      pvVar3 = std::__cxx11::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)&tz_delta,3);
      std::__cxx11::sub_match::operator_cast_to_string(&local_120,(sub_match *)pvVar3);
      day = pdf_time_to_qpdf_time::anon_class_1_0_00000001::operator()(&local_59,&local_120);
      pvVar3 = std::__cxx11::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)&tz_delta,4);
      std::__cxx11::sub_match::operator_cast_to_string(&local_140,(sub_match *)pvVar3);
      hour = pdf_time_to_qpdf_time::anon_class_1_0_00000001::operator()(&local_59,&local_140);
      pvVar3 = std::__cxx11::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)&tz_delta,5);
      std::__cxx11::sub_match::operator_cast_to_string(&local_160,(sub_match *)pvVar3);
      minute = pdf_time_to_qpdf_time::anon_class_1_0_00000001::operator()(&local_59,&local_160);
      pvVar3 = std::__cxx11::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)&tz_delta,6);
      std::__cxx11::sub_match::operator_cast_to_string(&local_180,(sub_match *)pvVar3);
      second = pdf_time_to_qpdf_time::anon_class_1_0_00000001::operator()(&local_59,&local_180);
      QPDFTime::QPDFTime(&local_bc,iVar2,month,day,hour,minute,second,local_58);
      qtm->year = local_bc.year;
      qtm->month = local_bc.month;
      qtm->day = local_bc.day;
      qtm->hour = local_bc.hour;
      qtm->minute = local_bc.minute;
      qtm->second = local_bc.second;
      qtm->tz_delta = local_bc.tz_delta;
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_e0);
    }
    str_local._7_1_ = true;
  }
  else {
    str_local._7_1_ = false;
  }
  uStack_54 = 1;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)&tz_delta);
  return str_local._7_1_;
}

Assistant:

bool
QUtil::pdf_time_to_qpdf_time(std::string const& str, QPDFTime* qtm)
{
    static std::regex pdf_date(
        "^D:([0-9]{4})([0-9]{2})([0-9]{2})"
        "([0-9]{2})([0-9]{2})([0-9]{2})"
        "(?:(Z?)|([\\+\\-])([0-9]{2})'([0-9]{2})')$");
    std::smatch m;
    if (!std::regex_match(str, m, pdf_date)) {
        return false;
    }
    int tz_delta = 0;
    auto to_i = [](std::string const& s) { return QUtil::string_to_int(s.c_str()); };

    if (m[8] != "") {
        tz_delta = ((to_i(m[9]) * 60) + to_i(m[10]));
        if (m[8] == "+") {
            tz_delta = -tz_delta;
        }
    }
    if (qtm) {
        *qtm = QPDFTime(
            to_i(m[1]), to_i(m[2]), to_i(m[3]), to_i(m[4]), to_i(m[5]), to_i(m[6]), tz_delta);
    }
    return true;
}